

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool __thiscall
ON_Extrusion::GetSurfaceParameterFromNurbFormParameter
          (ON_Extrusion *this,double nurbs_s,double nurbs_t,double *surface_s,double *surface_t)

{
  int iVar1;
  byte local_51;
  double t;
  double *p;
  double *pdStack_30;
  bool rc;
  double *surface_t_local;
  double *surface_s_local;
  double nurbs_t_local;
  double nurbs_s_local;
  ON_Extrusion *this_local;
  
  p._7_1_ = true;
  pdStack_30 = surface_t;
  surface_t_local = surface_s;
  surface_s_local = (double *)nurbs_t;
  nurbs_t_local = nurbs_s;
  if ((this->m_bTransposed & 1U) != 0) {
    pdStack_30 = surface_s;
    surface_t_local = surface_t;
    surface_s_local = (double *)nurbs_s;
    nurbs_t_local = nurbs_t;
  }
  if (surface_t_local != (double *)0x0) {
    if (this->m_profile == (ON_Curve *)0x0) {
      local_51 = 0;
    }
    else {
      iVar1 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x41])
                        (nurbs_t_local,this->m_profile,surface_t_local);
      local_51 = -(char)iVar1;
    }
    p._7_1_ = (bool)(local_51 & 1);
  }
  if (pdStack_30 != (double *)0x0) {
    *pdStack_30 = (double)surface_s_local;
  }
  return p._7_1_;
}

Assistant:

bool ON_Extrusion::GetSurfaceParameterFromNurbFormParameter(
      double nurbs_s, double nurbs_t,
      double* surface_s, double* surface_t
      ) const
{
  bool rc = true;
  if ( m_bTransposed )
  {
    double* p = surface_s; 
    surface_s = surface_t; 
    surface_t = p;
    double t = nurbs_s;
    nurbs_s = nurbs_t;
    nurbs_t = t;
  }
  if ( surface_s )
  {
    rc = m_profile 
       ? (m_profile->GetCurveParameterFromNurbFormParameter(nurbs_s,surface_s)?true:false) 
       : false;
  }
  if ( surface_t )
    *surface_t = nurbs_t;
  return rc;
}